

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Fire_PDU.cpp
# Opt level: O0

KBOOL __thiscall KDIS::PDU::LE_Fire_PDU::operator==(LE_Fire_PDU *this,LE_Fire_PDU *Value)

{
  KBOOL KVar1;
  LE_Fire_PDU *Value_local;
  LE_Fire_PDU *this_local;
  
  KVar1 = LE_Header::operator!=(&this->super_LE_Header,&Value->super_LE_Header);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else if ((this->m_FireFlagUnion).m_ui8Flag == (Value->m_FireFlagUnion).m_ui8Flag) {
    KVar1 = DATA_TYPE::LE_EntityIdentifier::operator!=(&this->m_TargetID,&Value->m_TargetID);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else {
      KVar1 = DATA_TYPE::LE_EntityIdentifier::operator!=(&this->m_MunitionID,&Value->m_MunitionID);
      if (KVar1) {
        this_local._7_1_ = false;
      }
      else {
        KVar1 = DATA_TYPE::LE_EntityIdentifier::operator!=(&this->m_EventID,&Value->m_EventID);
        if (KVar1) {
          this_local._7_1_ = false;
        }
        else {
          KVar1 = DATA_TYPE::MunitionDescriptor::operator!=
                            (&this->m_MunitionDesc,&Value->m_MunitionDesc);
          if (KVar1) {
            this_local._7_1_ = false;
          }
          else {
            KVar1 = DATA_TYPE::RelativeWorldCoordinates::operator!=(&this->m_Loc,&Value->m_Loc);
            if (KVar1) {
              this_local._7_1_ = false;
            }
            else {
              KVar1 = DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>_>::
                      operator!=(&this->m_Vel,&Value->m_Vel);
              if (KVar1) {
                this_local._7_1_ = false;
              }
              else if (this->m_ui16Range == Value->m_ui16Range) {
                this_local._7_1_ = true;
              }
              else {
                this_local._7_1_ = false;
              }
            }
          }
        }
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL LE_Fire_PDU::operator == ( const LE_Fire_PDU & Value ) const
{
    if( LE_Header::operator       != ( Value ) )                       return false;
    if( m_FireFlagUnion.m_ui8Flag != Value.m_FireFlagUnion.m_ui8Flag ) return false;
    if( m_TargetID                != Value.m_TargetID )                return false;
    if( m_MunitionID              != Value.m_MunitionID )              return false;
    if( m_EventID                 != Value.m_EventID )                 return false;
    if( m_MunitionDesc            != Value.m_MunitionDesc )            return false;
    if( m_Loc                     != Value.m_Loc )                     return false;
    if( m_Vel                     != Value.m_Vel )                     return false;
    if( m_ui16Range               != Value.m_ui16Range )               return false;
    return true;
}